

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WheatsheafAndWheatsheafMeanWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar,
          int ensemble_id)

{
  int iVar1;
  pointer pmVar2;
  int *piVar3;
  mapped_type *pmVar4;
  code *pcVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  bool *pbVar10;
  undefined4 in_register_0000000c;
  int *piVar11;
  long *plVar12;
  OASIS_FLOAT OVar13;
  outkey2 oVar14;
  int in_stack_00000010;
  allocator_type local_129;
  vector<int,_std::allocator<int>_> fileIDs;
  vector<int,_std::allocator<int>_> fileIDs_1;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> maxPeriodNo;
  
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &items._M_t._M_impl.super__Rb_tree_header._M_header;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  maxPeriodNo._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &maxPeriodNo._M_t._M_impl.super__Rb_tree_header._M_header;
  maxPeriodNo._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  maxPeriodNo._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  maxPeriodNo._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  maxPeriodNo._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       maxPeriodNo._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&unusedperiodstoweighting._M_t,&(this->periodstoweighting_)._M_t);
  if (in_stack_00000010 == 0) {
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    plVar12 = (long *)((long)&fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish +
                      CONCAT44(in_register_0000000c,epcalc) + 4);
    for (p_Var9 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var9 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ._0_4_ = p_Var9[1]._M_color;
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ._4_4_ = *(undefined4 *)&p_Var9[1].field_0x4;
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = *(int *)&p_Var9[1]._M_parent;
      oVar14 = *(outkey2 *)(p_Var9 + 1);
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = *(undefined4 *)((long)&p_Var9[1]._M_parent + 4);
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)CONCAT44(fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             *(undefined4 *)&p_Var9[1]._M_left);
      pcVar5 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        pcVar5 = *(code **)(*plVar12 + -1 + GetOutLoss);
      }
      OVar13 = (OASIS_FLOAT)(*pcVar5)(plVar12);
      FillWheatsheafItems(this,oVar14,&items,OVar13,&maxPeriodNo,&unusedperiodstoweighting);
    }
  }
  else {
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator[](&this->ensembletosidx_,&stack0x00000010);
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    plVar12 = (long *)((long)&fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish +
                      CONCAT44(in_register_0000000c,epcalc) + 4);
    for (p_Var6 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var6 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)CONCAT44(fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             *(undefined4 *)&p_Var6[1]._M_left);
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ._0_4_ = (_Rb_tree_color)*(undefined8 *)(p_Var6 + 1);
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ._4_4_ = (undefined4)((ulong)*(undefined8 *)(p_Var6 + 1) >> 0x20);
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = (int)p_Var6[1]._M_parent;
      fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = (undefined4)((ulong)p_Var6[1]._M_parent >> 0x20);
      pmVar4 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->ensembletosidx_,&stack0x00000010);
      piVar3 = (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar11 = (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; piVar11 != piVar3; piVar11 = piVar11 + 1) {
        iVar1 = *piVar11;
        if ((int)fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish == iVar1) {
          pcVar5 = (code *)GetOutLoss;
          if ((GetOutLoss & 1) != 0) {
            pcVar5 = *(code **)(*plVar12 + -1 + GetOutLoss);
          }
          oVar14.period_no =
               fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start._4_4_;
          oVar14.summary_id =
               (_Rb_tree_color)
               fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start;
          OVar13 = (OASIS_FLOAT)(*pcVar5)(plVar12);
          oVar14.sidx = iVar1;
          FillWheatsheafItems(this,oVar14,&items,OVar13,&maxPeriodNo,&unusedperiodstoweighting);
        }
      }
    }
  }
  pbVar10 = this->outputFlags_;
  piVar11 = (handles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  if (pbVar10[piVar11[1]] == true) {
    this_00 = (_Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
               *)operator_new(0x30);
    p_Var7 = &(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x0;
    *(undefined8 *)&((_Rep_type *)&this_00->_M_impl)->_M_impl = 0;
    *(undefined8 *)&(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header = 0;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left =
         &p_Var7->_M_header;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_right =
         &p_Var7->_M_header;
    (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_node_count = 0;
    for (p_Var9 = (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(this->summaryids_)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<mean_count,_std::allocator<mean_count>_>::vector
                ((vector<mean_count,_std::allocator<mean_count>_> *)&fileIDs,
                 (long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,(value_type *)&fileIDs_1,&local_129);
      pmVar8 = std::
               map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
               ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                             *)this_00,(key_type *)(p_Var9 + 1));
      std::vector<mean_count,_std::allocator<mean_count>_>::_M_move_assign
                (pmVar8,(_Vector_base<mean_count,_std::allocator<mean_count>_> *)&fileIDs);
      std::_Vector_base<mean_count,_std::allocator<mean_count>_>::~_Vector_base
                ((_Vector_base<mean_count,_std::allocator<mean_count>_> *)&fileIDs);
    }
    pbVar10 = this->outputFlags_;
    piVar11 = (handles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    this_00 = (_Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
               *)0x0;
  }
  fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0;
  fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  if (pbVar10[*piVar11] == true) {
    GetFileIDs(&fileIDs_1,this,*piVar11,1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&fileIDs_1.super__Vector_base<int,_std::allocator<int>_>);
  }
  WritePerSampleExceedanceProbabilityTable
            (this,&fileIDs,&items,eptype_tvar,ensemble_id,&unusedperiodstoweighting,
             (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
              *)this_00);
  iVar1 = (handles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[1];
  if (this->outputFlags_[iVar1] != false) {
    GetFileIDs(&fileIDs_1,this,iVar1,0);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&fileIDs,&fileIDs_1.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&fileIDs_1.super__Vector_base<int,_std::allocator<int>_>);
    WriteWheatsheafMean(this,&fileIDs,eptype,eptype_tvar,ensemble_id,
                        (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                         *)this_00);
    if (this_00 !=
        (_Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
         *)0x0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
      ::~_Rb_tree(this_00);
    }
    operator_delete(this_00);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&fileIDs.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&unusedperiodstoweighting._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&maxPeriodNo._M_t);
  std::
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~_Rb_tree(&items._M_t);
  return;
}

Assistant:

void aggreports::WheatsheafAndWheatsheafMeanWithWeighting(
	const std::vector<int> handles, OASIS_FLOAT (OutLosses::*GetOutLoss)(),
	const int epcalc, const int eptype, const int eptype_tvar,
	int ensemble_id) {

  std::map<wheatkey, lossvec2> items;
  int samplesize;
  std::map<int, int> maxPeriodNo;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  if (ensemble_id != 0) {
    samplesize = (int)ensembletosidx_[ensemble_id].size();
    for (auto x : (*out_loss_)[SAMPLES]) {
      for (auto sidx : ensembletosidx_[ensemble_id]) {
	if (x.first.sidx == sidx) {
	  FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)(),
			      maxPeriodNo, unusedperiodstoweighting);
	}
      }
    }
  } else {
    samplesize = samplesize_;
    for (auto x : (*out_loss_)[SAMPLES]) {
      FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)(),
			  maxPeriodNo, unusedperiodstoweighting);
    }
  }

  // Map for Wheatsheaf mean - calculate Wheatsheaf mean at same time as
  // Wheatsheaf. There is no need to check for a return period file, as
  // this is checked earlier in aggreports::LoadPeriodsToWeighting().
  std::map<int, std::vector<mean_count>> *temp_map = nullptr;
  if (outputFlags_[handles[WHEATSHEAF_MEAN]]) {
    temp_map = new std::map<int, std::vector<mean_count>>();
    for (auto it = summaryids_.begin(); it != summaryids_.end(); ++it) {
      (*temp_map)[*it] = std::vector<mean_count>(returnperiods_.size(),
						 mean_count());
    }
  }


  std::vector<int> fileIDs;
  if (outputFlags_[handles[WHEATSHEAF]] == true) {
    std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF], PSEPT);
  }
  WritePerSampleExceedanceProbabilityTable(fileIDs, items, eptype, eptype_tvar,
					   unusedperiodstoweighting, temp_map);

  if (outputFlags_[handles[WHEATSHEAF_MEAN]] == false) return;

  fileIDs = GetFileIDs(handles[WHEATSHEAF_MEAN]);
  WriteWheatsheafMean(fileIDs, epcalc, eptype, eptype_tvar, temp_map);

  delete temp_map;   // tidy up
  temp_map = nullptr;

}